

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O1

factor * __thiscall merlin::factor::normalize(factor *this)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  double dVar6;
  
  pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  dVar6 = 0.0;
  pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pdVar4 = pdVar1; pdVar4 != pdVar2; pdVar4 = pdVar4 + 1) {
    dVar6 = dVar6 + *pdVar4;
  }
  if ((pdVar1 != pdVar2) && ((dVar6 != 0.0 || (NAN(dVar6))))) {
    lVar3 = (long)pdVar2 - (long)pdVar1 >> 3;
    lVar5 = 0;
    do {
      pdVar1[lVar5] = pdVar1[lVar5] / dVar6;
      lVar5 = lVar5 + 1;
    } while (lVar3 + (ulong)(lVar3 == 0) != lVar5);
  }
  return this;
}

Assistant:

factor& normalize() {
		double Z = sum();
		if (Z != 0)
			*this /= Z;
		return *this;
	}